

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O3

MPP_RET avsd_reset_parameters(AvsdCtx_t *p_dec)

{
  undefined8 *puVar1;
  avsd_memory_t *paVar2;
  long lVar3;
  long lVar4;
  
  set_frame_output(p_dec,p_dec->dpb[1]);
  set_frame_output(p_dec,p_dec->dpb[0]);
  set_frame_output(p_dec,p_dec->cur);
  set_frame_unref(p_dec,p_dec->dpb[1]);
  set_frame_unref(p_dec,p_dec->dpb[0]);
  set_frame_unref(p_dec,p_dec->cur);
  (p_dec->vsh).version_checked = '\0';
  p_dec->dpb[0] = (AvsdFrame_t *)0x0;
  p_dec->dpb[1] = (AvsdFrame_t *)0x0;
  p_dec->cur = (AvsdFrame_t *)0x0;
  lVar3 = 0x110;
  lVar4 = 0;
  do {
    paVar2 = p_dec->mem;
    puVar1 = (undefined8 *)((long)&(paVar2->syntax).pp.profileId + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(paVar2->syntax).pp.weightingQuantParamDelta1 + lVar3 + -0x78);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(paVar2->syntax).pp.bitRateValue + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(paVar2->syntax).pp.verticalSize + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(int *)((long)&(paVar2->syntax).pp.levelId + lVar3) = (int)lVar4;
    *(undefined4 *)((long)(paVar2->syntax).pp.weightingQuantParamDelta1 + lVar3 + -0x6c) =
         0xffffffff;
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x40;
  } while (lVar4 != 3);
  return MPP_OK;
}

Assistant:

MPP_RET avsd_reset_parameters(AvsdCtx_t *p_dec)
{
    RK_U32 i = 0;

    set_frame_output(p_dec, p_dec->dpb[1]);
    set_frame_output(p_dec, p_dec->dpb[0]);
    set_frame_output(p_dec, p_dec->cur);
    set_frame_unref(p_dec, p_dec->dpb[1]);
    set_frame_unref(p_dec, p_dec->dpb[0]);
    set_frame_unref(p_dec, p_dec->cur);

    p_dec->cur = NULL;
    p_dec->dpb[0] = NULL;
    p_dec->dpb[1] = NULL;

    p_dec->vsh.version_checked = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_dec->mem->save); i++) {
        AvsdFrame_t *frm = &p_dec->mem->save[i];

        memset(frm, 0, sizeof(*frm));
        frm->idx = i;
        frm->slot_idx = -1;
    }

    return MPP_OK;
}